

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O3

Lf_Cut_t * Lf_MemLoadCut(Lf_Mem_t *p,int iCur,int iObj,Lf_Cut_t *pCut,int fTruth,int fRecycle)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  void **ppvVar7;
  byte bVar8;
  byte bVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  
  bVar5 = (byte)p->LogPage & 0x1f;
  uVar16 = (uint)iCur >> bVar5;
  if ((p->vPages).nSize <= (int)uVar16) {
    __assert_fail("Page < Vec_PtrSize(&p->vPages)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x227,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  if ((int)((uint)iCur >> bVar5) < 0) {
LAB_006d9b2d:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pbVar13 = (byte *)((ulong)(uint)(iCur & p->MaskPage) + (long)(p->vPages).pArray[uVar16]);
  pbVar14 = pbVar13 + 1;
  bVar9 = *pbVar13;
  uVar11 = (uint)bVar9;
  bVar8 = 0;
  if ((char)bVar9 < '\0') {
    bVar8 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 | (uVar11 & 0x7f) << (bVar8 & 0x1f);
      bVar9 = *pbVar14;
      uVar11 = (uint)bVar9;
      pbVar14 = pbVar14 + 1;
      bVar8 = bVar8 + 7;
    } while ((char)bVar9 < '\0');
  }
  else {
    uVar6 = 0;
  }
  uVar6 = uVar11 << (bVar8 & 0x1f) | uVar6;
  pCut->field_0x17 = (char)uVar6;
  if (0xc < (uVar6 & 0xff)) {
    __assert_fail("pCut->nLeaves <= LF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                  ,0x22a,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
  }
  if ((uVar6 & 0xff) != 0) {
    uVar10 = (ulong)(uVar6 & 0xff);
    do {
      bVar9 = *pbVar14;
      uVar11 = (uint)bVar9;
      pbVar14 = pbVar14 + 1;
      bVar8 = 0;
      if ((char)bVar9 < '\0') {
        bVar8 = 0;
        uVar12 = 0;
        do {
          uVar12 = uVar12 | (uVar11 & 0x7f) << (bVar8 & 0x1f);
          bVar9 = *pbVar14;
          uVar11 = (uint)bVar9;
          pbVar14 = pbVar14 + 1;
          bVar8 = bVar8 + 7;
        } while ((char)bVar9 < '\0');
      }
      else {
        uVar12 = 0;
      }
      iObj = iObj - (uVar11 << (bVar8 & 0x1f) | uVar12);
      *(int *)(&pCut->field_0x14 + uVar10 * 4) = iObj;
      bVar4 = 1 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar4);
  }
  if (fTruth == 0) {
    pCut->iFunc = -1;
  }
  else {
    uVar11 = (uint)*pbVar14;
    bVar9 = 0;
    if ((char)*pbVar14 < '\0') {
      bVar9 = 0;
      uVar12 = 0;
      do {
        pbVar14 = pbVar14 + 1;
        uVar12 = uVar12 | (uVar11 & 0x7f) << (bVar9 & 0x1f);
        uVar11 = (uint)*pbVar14;
        bVar9 = bVar9 + 7;
      } while ((char)*pbVar14 < '\0');
    }
    else {
      uVar12 = 0;
    }
    uVar12 = uVar11 << (bVar9 & 0x1f) | uVar12;
    pCut->iFunc = uVar12;
    if ((uVar6 << 0x18 < 0x2000000) && (3 < (int)uVar12)) {
      __assert_fail("pCut->nLeaves >= 2 || pCut->iFunc <= 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaLf.c"
                    ,0x22e,"Lf_Cut_t *Lf_MemLoadCut(Lf_Mem_t *, int, int, Lf_Cut_t *, int, int)");
    }
  }
  if ((uint)iCur >> bVar5 == 0 || fRecycle == 0) {
    if (fRecycle != 0) goto LAB_006d9ae7;
    uVar16 = *(uint *)&pCut->field_0x14;
  }
  else {
    if ((p->vPages).nSize < (int)uVar16) goto LAB_006d9b2d;
    pvVar2 = (p->vPages).pArray[uVar16 - 1];
    if (pvVar2 != (void *)0x0) {
      pVVar3 = p->vFree;
      uVar11 = pVVar3->nSize;
      if (uVar11 == pVVar3->nCap) {
        if ((int)uVar11 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar7;
          pVVar3->nCap = 0x10;
        }
        else {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar11 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar3->pArray,(ulong)uVar11 << 4);
          }
          pVVar3->pArray = ppvVar7;
          pVVar3->nCap = uVar11 * 2;
        }
      }
      else {
        ppvVar7 = pVVar3->pArray;
      }
      iVar1 = pVVar3->nSize;
      pVVar3->nSize = iVar1 + 1;
      ppvVar7[iVar1] = pvVar2;
      if ((p->vPages).nSize < (int)uVar16) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      (p->vPages).pArray[uVar16 - 1] = (void *)0x0;
    }
LAB_006d9ae7:
    uVar16 = *(uint *)&pCut->field_0x14;
    if (0xffffff < uVar16) {
      uVar15 = 0;
      uVar10 = 0;
      do {
        uVar10 = uVar10 | 1L << ((ulong)*(byte *)((long)&pCut[1].Sign + uVar15 * 4) & 0x3f);
        uVar15 = uVar15 + 1;
      } while (uVar16 >> 0x18 != uVar15);
      goto LAB_006d9b10;
    }
  }
  uVar10 = 0;
LAB_006d9b10:
  pCut->Sign = uVar10;
  *(uint *)&pCut->field_0x14 = uVar16 & 0xff7fffff;
  return pCut;
}

Assistant:

static inline Lf_Cut_t * Lf_MemLoadCut( Lf_Mem_t * p, int iCur, int iObj, Lf_Cut_t * pCut, int fTruth, int fRecycle )
{
    unsigned char * pPlace;  
    int i, Prev = iObj, Page = iCur >> p->LogPage;
    assert( Page < Vec_PtrSize(&p->vPages) );
    pPlace = (unsigned char *)Vec_PtrEntry(&p->vPages, Page) + (iCur & p->MaskPage);
    pCut->nLeaves = Gia_AigerReadUnsigned(&pPlace);
    assert( pCut->nLeaves <= LF_LEAF_MAX );
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
        pCut->pLeaves[i] = Prev - Gia_AigerReadUnsigned(&pPlace), Prev = pCut->pLeaves[i];
    pCut->iFunc = fTruth ? Gia_AigerReadUnsigned(&pPlace) : -1;
    assert( pCut->nLeaves >= 2 || pCut->iFunc <= 3 );
    if ( fRecycle && Page && Vec_PtrEntry(&p->vPages, Page-1) )
    {
        Vec_PtrPush( p->vFree, Vec_PtrEntry(&p->vPages, Page-1) );
        Vec_PtrWriteEntry( &p->vPages, Page-1, NULL );
    }
    pCut->Sign = fRecycle ? Lf_CutGetSign(pCut) : 0;
    pCut->fMux7 = 0;
    return pCut;
}